

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int llhttp__after_headers_complete(llhttp_t *parser,char *p,char *endp)

{
  uint8_t uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  bool bVar5;
  
  uVar2 = parser->flags;
  bVar5 = true;
  if ((uVar2 & 8) == 0) {
    bVar5 = parser->content_length != 0;
  }
  if ((parser->upgrade == '\0') ||
     ((iVar4 = 1, parser->method != '\x05' && ((bool)((uVar2 & 0x40) == 0 & bVar5))))) {
    uVar1 = parser->type;
    if (uVar1 == '\x02') {
      if (parser->status_code == 0x65) {
        return 1;
      }
      if ((uVar2 & 0x40) != 0) {
        return 0;
      }
      if (parser->status_code == 100) {
        return 0;
      }
    }
    else if ((uVar2 & 0x40) != 0) {
      return 0;
    }
    if (uVar1 == '\x02') {
      uVar3 = parser->status_code;
      if (uVar3 - 0x66 < 2) {
        return 0;
      }
      if (uVar3 == 0xcc) {
        return 0;
      }
      if (uVar3 == 0x130) {
        return 0;
      }
    }
    iVar4 = 2;
    if ((uVar2 & 8) == 0) {
      if ((uVar2 >> 9 & 1) != 0) {
        if ((uVar1 == '\x01') && ((parser->lenient_flags & 10) == 0)) {
          return 5;
        }
        return 4;
      }
      if ((uVar2 & 0x20) == 0) {
        iVar4 = llhttp_message_needs_eof(parser);
        return (uint)(iVar4 != 0) << 2;
      }
      iVar4 = (uint)(parser->content_length != 0) * 3;
    }
  }
  return iVar4;
}

Assistant:

int llhttp__after_headers_complete(llhttp_t* parser, const char* p,
                                   const char* endp) {
  int hasBody;

  hasBody = parser->flags & F_CHUNKED || parser->content_length > 0;
  if (
      (parser->upgrade && (parser->method == HTTP_CONNECT ||
                          (parser->flags & F_SKIPBODY) || !hasBody)) ||
      /* See RFC 2616 section 4.4 - 1xx e.g. Continue */
      (parser->type == HTTP_RESPONSE && parser->status_code == 101)
  ) {
    /* Exit, the rest of the message is in a different protocol. */
    return 1;
  }

  if (parser->type == HTTP_RESPONSE && parser->status_code == 100) {
    /* No body, restart as the message is complete */
    return 0;
  }

  /* See RFC 2616 section 4.4 */
  if (
    parser->flags & F_SKIPBODY ||         /* response to a HEAD request */
    (
      parser->type == HTTP_RESPONSE && (
        parser->status_code == 102 ||     /* Processing */
        parser->status_code == 103 ||     /* Early Hints */
        parser->status_code == 204 ||     /* No Content */
        parser->status_code == 304        /* Not Modified */
      )
    )
  ) {
    return 0;
  } else if (parser->flags & F_CHUNKED) {
    /* chunked encoding - ignore Content-Length header, prepare for a chunk */
    return 2;
  } else if (parser->flags & F_TRANSFER_ENCODING) {
    if (parser->type == HTTP_REQUEST &&
        (parser->lenient_flags & LENIENT_CHUNKED_LENGTH) == 0 &&
        (parser->lenient_flags & LENIENT_TRANSFER_ENCODING) == 0) {
      /* RFC 7230 3.3.3 */

      /* If a Transfer-Encoding header field
       * is present in a request and the chunked transfer coding is not
       * the final encoding, the message body length cannot be determined
       * reliably; the server MUST respond with the 400 (Bad Request)
       * status code and then close the connection.
       */
      return 5;
    } else {
      /* RFC 7230 3.3.3 */

      /* If a Transfer-Encoding header field is present in a response and
       * the chunked transfer coding is not the final encoding, the
       * message body length is determined by reading the connection until
       * it is closed by the server.
       */
      return 4;
    }
  } else {
    if (!(parser->flags & F_CONTENT_LENGTH)) {
      if (!llhttp_message_needs_eof(parser)) {
        /* Assume content-length 0 - read the next */
        return 0;
      } else {
        /* Read body until EOF */
        return 4;
      }
    } else if (parser->content_length == 0) {
      /* Content-Length header given but zero: Content-Length: 0\r\n */
      return 0;
    } else {
      /* Content-Length header given and non-zero */
      return 3;
    }
  }
}